

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_generic_fread(mcpl_generic_filehandle_t *fh,char *dest,uint64_t nbytes)

{
  uint uVar1;
  char *in_RDX;
  mcpl_generic_filehandle_t *in_RSI;
  mcpl_generic_filehandle_t *in_RDI;
  uint actually_read;
  uint to_read;
  uint64_t chunk_max;
  uint64_t in_stack_ffffffffffffffe0;
  
  for (; (char *)0x1fffffff < in_RDX; in_RDX = in_RDX + -0x1fffffff) {
    mcpl_generic_fread(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    in_RSI = (mcpl_generic_filehandle_t *)((long)&in_RSI[0x1555555].internal + 7);
  }
  if ((in_RDX != (char *)0x0) &&
     (uVar1 = mcpl_generic_fread_try(in_RDI,(char *)in_RSI,(uint)((ulong)in_RDX >> 0x20)),
     uVar1 != (uint)in_RDX)) {
    mcpl_error((char *)0x10a6dd);
  }
  return;
}

Assistant:

void mcpl_generic_fread( mcpl_generic_filehandle_t* fh,
                         char * dest, uint64_t nbytes )
{
  MCPL_STATIC_ASSERT( sizeof(size_t) >= sizeof(uint32_t) );
  MCPL_STATIC_ASSERT( sizeof(int) >= sizeof(int32_t) );
  MCPL_STATIC_ASSERT( sizeof(z_off_t) >= sizeof(int32_t) );

  //Ensure we only call gzread/fread with requests well inside 32bit limit (even
  //signed since gzread can read at most INT_MAX).
  const uint64_t chunk_max = INT32_MAX / 4;
  while ( nbytes > chunk_max ) {
    mcpl_generic_fread( fh, dest, chunk_max );
    nbytes -= chunk_max;
    dest += chunk_max;
  }

  if ( !nbytes )
    return;

  unsigned to_read = (unsigned)nbytes;
  unsigned actually_read = mcpl_generic_fread_try( fh, dest, to_read );
  if ( actually_read != to_read )
    mcpl_error("Error while reading from file");
}